

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int sprint_dns_header(char *dest,char *src)

{
  byte val;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  uint value;
  dns_header header;
  
  read_dns_header(&header,src);
  val = (byte)header.field_1.flags >> 3;
  uVar5 = (uint)(ushort)(header.field_1.flags << 8 | header.field_1.flags >> 8);
  iVar1 = (int)src;
  if ((char)(byte)header.field_1.flags < '\0') {
    bit_to_str(val & 0xf,iVar1);
    pcVar6 = "Unknow";
    if ((header.field_1.flags >> 3 & 0xf) == 1) {
      pcVar6 = "Reverse query (1)";
    }
    pcVar3 = "Standard query (0)";
    if ((header.field_1.flags >> 3 & 0xf) != 0) {
      pcVar3 = pcVar6;
    }
    pcVar6 = "Server is an authority for domain";
    if ((header.field_1.flags >> 2 & 1) == 0) {
      pcVar6 = "Server is not an authority for domain";
    }
    pcVar8 = "Message is truncated";
    if ((header.field_1.flags >> 1 & 1) == 0) {
      pcVar8 = "Message is not truncated";
    }
    pcVar7 = "Do query recursively";
    pcVar10 = "Do query recursively";
    if ((header.field_1.flags & 1) == 0) {
      pcVar10 = "Can\'t do recursively";
    }
    if (-1 < (short)header.field_1.flags) {
      pcVar7 = "Can\'t do recursively";
    }
    pcVar11 = "Answer/authority portion was authenticated by the server";
    if ((header.field_1.flags >> 0xd & 1) == 0) {
      pcVar11 = "Answer/authority portion was not authenticated by the server";
    }
    pcVar9 = "Authenticated data";
    if ((header.field_1.flags >> 0xc & 1) == 0) {
      pcVar9 = "Non-authenticated data";
    }
    value = header.field_1.flags >> 8 & 0xf;
    bit_to_str((uchar)value,iVar1);
    pcVar4 = debugstr(9,value);
    iVar1 = sprintf(dest,
                    "------------------------------------\nTransaction ID: 0x%2x\nFLAG: 0x%04x\n%d... .... .... .... = Response:%s\n.%s... .... .... = Opcode: %s\n.... .%d.. .... .... = Authoritative: %s\n.... ..%d. .... .... = Truncated: %s\n.... ...%d .... .... = Recursion desired: %s\n.... .... %d... .... = Recursion available: %s\n.... .... .%d.. .... = Z: reserved (0)\n.... .... ..%d. .... = Answer authenticated: %s\n.... .... ..%d .... = %s\n.... .... .... %s = Reply code: %s\n"
                    ,(ulong)(uint)header.id,(ulong)uVar5,1,"Message is a response",bit_to_str::b,
                    pcVar3,(ulong)(header.field_1.flags >> 2 & 1),pcVar6,
                    (ulong)(header.field_1.flags >> 1 & 1),pcVar8,(ulong)(header.field_1.flags & 1),
                    pcVar10,(ulong)(header.field_1.flags >> 0xf),pcVar7,
                    (ulong)(header.field_1.flags >> 0xe & 1),
                    (ulong)(header.field_1.flags >> 0xd & 1),pcVar11,
                    (ulong)(header.field_1.flags >> 0xc & 1),pcVar9,bit_to_str::b,pcVar4);
  }
  else {
    bit_to_str(val,iVar1);
    pcVar6 = "Unknow";
    if ((header.field_1.flags >> 3 & 0xf) == 1) {
      pcVar6 = "Reverse query (1)";
    }
    pcVar3 = "Standard query (0)";
    if ((header.field_1.flags >> 3 & 0xf) != 0) {
      pcVar3 = pcVar6;
    }
    pcVar6 = "Message is truncated";
    if ((header.field_1.flags >> 1 & 1) == 0) {
      pcVar6 = "Message is not truncated";
    }
    pcVar8 = "Do query recursively";
    if ((header.field_1.flags & 1) == 0) {
      pcVar8 = "Can\'t do recursively";
    }
    pcVar10 = "Authenticated data";
    if ((header.field_1.flags >> 0xc & 1) == 0) {
      pcVar10 = "Non-authenticated data";
    }
    iVar1 = sprintf(dest,
                    "------------------------------------\nTransaction ID: 0x%2x\nFLAG: 0x%04x\n%d... .... .... .... = Response:%s\n.%s... .... ....  = Opcode: %s\n.... ..%d. .... .... = Truncated: %s\n.... ...%d .... .... = Recursion desired: %s\n.... .... .%d.. .... = Z: reserved (0)\n.... .... ...%d .... = %s\n"
                    ,(ulong)(uint)header.id,(ulong)uVar5,0,"Message is a query",bit_to_str::b,pcVar3
                    ,(ulong)(header.field_1.flags >> 1 & 1),pcVar6,(ulong)(header.field_1.flags & 1)
                    ,pcVar8,(ulong)(header.field_1.flags >> 0xe & 1),
                    (ulong)(header.field_1.flags >> 0xc & 1),pcVar10);
  }
  iVar2 = sprintf(dest + iVar1,
                  "Questions: %d\nAnswer answers: %d \nAuthority answers: %d\nAdditional answers: %d\n"
                  ,(ulong)header.qdcount,(ulong)header.ancount,(ulong)header.nscount,
                  (ulong)header.adcount);
  return iVar2 + iVar1;
}

Assistant:

int sprint_dns_header(char *dest, char *src) {
  struct dns_header header;
  read_dns_header(&header, src);
  int size = 0;
  if (!header.qr) {
    //询问
    size += sprintf(dest, "------------------------------------\n\
Transaction ID: 0x%2x\n\
FLAG: 0x%04x\n\\
%d... .... .... .... = Response:%s\n\
.%s... .... ....  = Opcode: %s\n\
.... ..%d. .... .... = Truncated: %s\n\
.... ...%d .... .... = Recursion desired: %s\n\
.... .... .%d.. .... = Z: reserved (0)\n\
.... .... ...%d .... = %s\n",
                    header.id,
                    ntohs(header.flags), //为了打印需要
                    0, debugstr(DEBUG_PRINT_TYPE_qr, header.qr),
                    bit_to_str(header.opcode, 4),
                    debugstr(DEBUG_PRINT_TYPE_opcode, header.opcode), header.tc,
                    debugstr(DEBUG_PRINT_TYPE_tc, header.tc), header.rd,
                    debugstr(DEBUG_PRINT_TYPE_rd, header.rd), header.z,
                    header.cd, debugstr(DEBUG_PRINT_TYPE_cd, header.cd));
  } else {
    //回答
    size += sprintf(
        dest, "------------------------------------\n\
Transaction ID: 0x%2x\n\
FLAG: 0x%04x\n\
%d... .... .... .... = Response:%s\n\
.%s... .... .... = Opcode: %s\n\
.... .%d.. .... .... = Authoritative: %s\n\
.... ..%d. .... .... = Truncated: %s\n\
.... ...%d .... .... = Recursion desired: %s\n\
.... .... %d... .... = Recursion available: %s\n\
.... .... .%d.. .... = Z: reserved (0)\n\
.... .... ..%d. .... = Answer authenticated: %s\n\
.... .... ..%d .... = %s\n\
.... .... .... %s = Reply code: %s\n",
        header.id,
        ntohs(header.flags), ////为了打印需要
        1, debugstr(DEBUG_PRINT_TYPE_qr, 1), bit_to_str(header.opcode, 4),
        debugstr(DEBUG_PRINT_TYPE_opcode, header.opcode), header.aa,
        debugstr(DEBUG_PRINT_TYPE_aa, header.aa), header.tc,
        debugstr(DEBUG_PRINT_TYPE_tc, header.tc), header.rd,
        debugstr(DEBUG_PRINT_TYPE_rd, header.rd), header.ra,
        debugstr(DEBUG_PRINT_TYPE_ra, header.ra), header.z, header.ad,
        debugstr(DEBUG_PRINT_TYPE_ad, header.ad), header.cd,
        debugstr(DEBUG_PRINT_TYPE_cd, header.cd), bit_to_str(header.rcode, 4),
        debugstr(DEBUG_PRINT_TYPE_rcode, header.rcode));
  }
  dest += size;
  size +=
      sprintf(dest, "Questions: %d\n\
Answer answers: %d \n\
Authority answers: %d\n\
Additional answers: %d\n",
              header.qdcount, header.ancount, header.nscount, header.adcount);
  return size;
}